

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

int cm_zlib_deflateEnd(z_streamp strm)

{
  int iVar1;
  int status;
  z_streamp strm_local;
  
  iVar1 = deflateStateCheck(strm);
  if (iVar1 == 0) {
    iVar1 = strm->state->status;
    if (strm->state->pending_buf != (Bytef *)0x0) {
      (*strm->zfree)(strm->opaque,strm->state->pending_buf);
    }
    if (strm->state->head != (Posf *)0x0) {
      (*strm->zfree)(strm->opaque,strm->state->head);
    }
    if (strm->state->prev != (Posf *)0x0) {
      (*strm->zfree)(strm->opaque,strm->state->prev);
    }
    if (strm->state->window != (Bytef *)0x0) {
      (*strm->zfree)(strm->opaque,strm->state->window);
    }
    (*strm->zfree)(strm->opaque,strm->state);
    strm->state = (internal_state *)0x0;
    strm_local._4_4_ = 0;
    if (iVar1 == 0x71) {
      strm_local._4_4_ = -3;
    }
  }
  else {
    strm_local._4_4_ = -2;
  }
  return strm_local._4_4_;
}

Assistant:

int ZEXPORT deflateEnd(z_streamp strm) {
    int status;

    if (deflateStateCheck(strm)) return Z_STREAM_ERROR;

    status = strm->state->status;

    /* Deallocate in reverse order of allocations: */
    TRY_FREE(strm, strm->state->pending_buf);
    TRY_FREE(strm, strm->state->head);
    TRY_FREE(strm, strm->state->prev);
    TRY_FREE(strm, strm->state->window);

    ZFREE(strm, strm->state);
    strm->state = Z_NULL;

    return status == BUSY_STATE ? Z_DATA_ERROR : Z_OK;
}